

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTNode.cpp
# Opt level: O2

void __thiscall AST::ASTNode::ASTNode(ASTNode *this,string *name,Token *token)

{
  int iVar1;
  string sStack_48;
  
  this->_vptr_ASTNode = (_func_int **)&PTR_accept_00145310;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::_Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::_Deque_base
            (&(this->children).super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>);
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  (this->type)._M_string_length = 0;
  (this->type).field_2._M_local_buf[0] = '\0';
  (this->tag)._M_dataplus._M_p = (pointer)&(this->tag).field_2;
  (this->tag)._M_string_length = 0;
  (this->tag).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)&this->name,(string *)name);
  if (token != (Token *)0x0) {
    iVar1 = Token::getLineno(token);
    this->lineNumber = iVar1;
    Token::getTypeString_abi_cxx11_(&sStack_48,token);
    std::__cxx11::string::operator=((string *)&this->type,(string *)&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  iVar1 = counter + 1;
  this->uniqueID = counter;
  counter = iVar1;
  return;
}

Assistant:

AST::ASTNode::ASTNode(std::string name, Token *token) {
    this->name = std::move(name);
    if (token != nullptr) {
        this->lineNumber = token->getLineno();
        this->type = token->getTypeString();
    }
    uniqueID = counter++;
}